

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O1

void renderer_COMPACT_FLAG_RENDERER_WITH_COMBINED_AUX
               (wchar_t *label,wchar_t nlabel,wchar_t *vals,wchar_t *auxvals,wchar_t n,
               ui_entry_details *details,renderer_info *info)

{
  wchar_t wVar1;
  wchar_t x;
  wchar_t y;
  wchar_t *pwVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  loc_conflict lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  wchar_t vc;
  ui_entry_combiner_funcs_conflict combiner;
  wchar_t local_6c;
  wchar_t local_68;
  wchar_t local_64;
  wchar_t *local_60;
  wchar_t *local_58;
  ui_entry_combiner_funcs local_50;
  
  local_64 = nlabel;
  local_60 = label;
  local_58 = auxvals;
  if (((L'\t' < info->ncolors) && (L'\x03' < info->nlabcolors)) && (L'\x04' < info->nsym)) {
    if (L'\0' < n) {
      lVar6.y = 0;
      lVar6.x = (details->value_position).x;
      uVar10 = (ulong)(uint)(details->value_position).y;
      uVar7 = (uint)details->alternate_color_first + (uint)details->alternate_color_first * 4;
      uVar9 = 0;
      do {
        wVar1 = vals[uVar9];
        if (wVar1 == L'\0') {
          uVar3 = 2;
        }
        else {
          uVar3 = 0;
          if (wVar1 != L'\x7fffffff') {
            if (wVar1 == L'\x7ffffffe') {
              uVar3 = 1;
            }
            else {
              uVar3 = 3;
            }
          }
        }
        uVar4 = uVar3;
        if (((1 < (uint)(local_58[uVar9] + L'\x80000002')) && (local_58[uVar9] != L'\0')) &&
           (uVar4 = 4, wVar1 != L'\0')) {
          uVar4 = uVar3;
        }
        Term_putch(lVar6.x,(wchar_t)uVar10,info->colors[uVar4 + uVar7],info->symbols[uVar4]);
        lVar6 = loc_sum((loc_conflict)((ulong)lVar6 & 0xffffffff | uVar10 << 0x20),
                        (loc_conflict)details->position_step);
        uVar10 = (ulong)lVar6 >> 0x20;
        uVar7 = uVar7 ^ 5;
        uVar9 = uVar9 + 1;
      } while ((uint)n != uVar9);
    }
    wVar1 = local_64;
    if ((L'\0' < local_64) || (details->show_combined == true)) {
      iVar5 = ui_entry_combiner_get_funcs(info->combiner_index,&local_50);
      if (iVar5 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/ui-entry-renderers.c"
                      ,0x2c6,
                      "void renderer_COMPACT_FLAG_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                     );
      }
      (*local_50.vec_func)(n,vals,local_58,&local_68,&local_6c);
      pwVar2 = local_60;
      if (L'\0' < wVar1) {
        if (details->known_rune == true) {
          if (((((uint)(local_68 + L'\x80000002') < 2) || (lVar8 = 2, local_68 == L'\0')) &&
              (lVar8 = 1, 1 < (uint)(local_6c + L'\x80000002'))) && (local_6c != L'\0')) {
            lVar8 = 3;
          }
        }
        else {
          lVar8 = 0;
        }
        x = (details->label_position).x;
        y = (details->label_position).y;
        if (details->vertical_label == true) {
          uVar9 = 1;
          if (L'\x01' < wVar1) {
            uVar9 = (ulong)(uint)wVar1;
          }
          uVar10 = 0;
          do {
            Term_putch(x,y + (int)uVar10,info->label_colors[lVar8],pwVar2[uVar10]);
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
        else {
          safe_queue_chars(x,y,wVar1,info->label_colors[lVar8],local_60);
        }
      }
      if (details->show_combined == true) {
        show_combined_generic(info,details,local_68,local_6c);
      }
    }
    return;
  }
  __assert_fail("info->ncolors >= 10 && info->nlabcolors >= 4 && info->nsym >= 5",
                "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/ui-entry-renderers.c"
                ,0x2a8,
                "void renderer_COMPACT_FLAG_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
               );
}

Assistant:

static void renderer_COMPACT_FLAG_RENDERER_WITH_COMBINED_AUX(
	const wchar_t *label,
	int nlabel,
	const int *vals,
	const int *auxvals,
	int n,
	const struct ui_entry_details *details,
	const struct renderer_info *info)
{
	struct loc p = details->value_position;
	int color_offset = (details->alternate_color_first) ? 5 : 0;
	struct ui_entry_combiner_funcs combiner;
	int vc, ac;
	int i;

	/* Check for defaults that are too short in list-ui-entry-renders.h. */
	assert(info->ncolors >= 10 && info->nlabcolors >= 4 && info->nsym >= 5);

	for (i = 0; i < n; ++i) {
		int palette_index = 2;

		if (vals[i] == UI_ENTRY_UNKNOWN_VALUE) {
			palette_index = 0;
		} else if (vals[i] == UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 1;
		} else if (vals[i]) {
			palette_index = 3;
		}
		if (auxvals[i] && auxvals[i] != UI_ENTRY_UNKNOWN_VALUE &&
			auxvals[i] != UI_ENTRY_VALUE_NOT_PRESENT) {
			if (vals[i] == 0) {
				palette_index = 4;
			}
		}
		Term_putch(p.x, p.y,
			info->colors[palette_index + color_offset],
			info->symbols[palette_index]);
		p = loc_sum(p, details->position_step);
		color_offset ^= 5;
	}

	if (nlabel <= 0 && !details->show_combined) {
		return;
	}

	if (ui_entry_combiner_get_funcs(info->combiner_index, &combiner)) {
		assert(0);
	}
	(*combiner.vec_func)(n, vals, auxvals, &vc, &ac);

	if (nlabel > 0) {
		int palette_index = 1;

		if (! details->known_rune) {
			palette_index = 0;
		} else if (vc && vc != UI_ENTRY_UNKNOWN_VALUE &&
			vc != UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 2;
		} else if (ac && ac != UI_ENTRY_UNKNOWN_VALUE &&
			ac != UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 3;
		}
		if (details->vertical_label) {
			p = details->label_position;
			for (i = 0; i < nlabel; ++i) {
				Term_putch(p.x, p.y,
					info->label_colors[palette_index],
					label[i]);
				p.y += 1;
			}
		} else {
			safe_queue_chars(details->label_position.x,
				details->label_position.y, nlabel,
				info->label_colors[palette_index], label);
		}
	}

	if (details->show_combined) {
		show_combined_generic(info, details, vc, ac);
	}
}